

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_meta___call(lua_State *L)

{
  CTSize *pCVar1;
  TValue *pTVar2;
  ushort uVar3;
  uint32_t uVar4;
  CTSize CVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  cTValue *pcVar9;
  void *pvVar10;
  TValue *pTVar11;
  GCstr *pGVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  MMS mm;
  uint uVar16;
  GCstr *name;
  CType *pCVar17;
  ulong uVar18;
  CTypeID id;
  CType *pCVar19;
  uint *puVar20;
  CTState *cts;
  cTValue *pcVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  CType *pCVar26;
  TValue *base;
  byte bVar27;
  MSize nfpr;
  int rcl [2];
  CCallState cc;
  ulong local_248;
  uint local_240 [2];
  ulong local_238;
  cTValue *local_230;
  cTValue local_228;
  cTValue acStack_220 [2];
  TValue *local_210;
  cTValue *local_208;
  ulong local_200;
  ulong local_1f8;
  uint local_1f0;
  byte local_1ec;
  char local_1eb;
  byte local_1ea;
  byte local_1e9;
  cTValue local_1e8 [16];
  cTValue local_168 [6];
  cTValue local_138 [33];
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  pTVar11 = L->base;
  local_210 = L->top;
  if ((local_210 <= pTVar11) || ((pTVar11->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar8 = (ulong)(pTVar11->u32).lo;
  uVar3 = *(ushort *)(uVar8 + 6);
  uVar23 = (uint)uVar3;
  if (uVar23 == 0x15) {
    pCVar19 = cts->tab;
    mm = MM_new;
    id = *(uint *)(uVar8 + 8);
    goto LAB_0014b703;
  }
  pCVar19 = cts->tab;
  uVar16 = pCVar19[uVar23].info & 0xf0000000;
  pCVar17 = pCVar19 + uVar23;
  if (uVar16 == 0x20000000) {
    pCVar1 = &pCVar17->size;
    uVar18 = (ulong)((pCVar19[uVar23].info & 0xffff) << 4);
    if ((*(uint *)((long)&pCVar19->info + uVar18) & 0xf0000000) != 0x60000000) goto LAB_0014b6f6;
    pCVar17 = (CType *)((long)&pCVar19->info + uVar18);
    if (*pCVar1 != 4) goto LAB_0014b637;
    local_1f8 = (ulong)*(uint *)(uVar8 + 8);
  }
  else {
    if (uVar16 != 0x60000000) {
LAB_0014b6f6:
      mm = MM_call;
      id = (uint)uVar3;
LAB_0014b703:
      if ((pCVar19[id].info & 0xf0000000) == 0x20000000) {
        id = pCVar19[id].info & 0xffff;
      }
      pcVar9 = lj_ctype_meta(cts,id,mm);
      if (pcVar9 == (cTValue *)0x0) {
        if (uVar3 == 0x15) {
          lj_cf_ffi_new(L);
          return 1;
        }
        pGVar12 = lj_ctype_repr(L,id,name);
        lj_err_callerv(L,LJ_ERR_FFI_BADCALL,pGVar12 + 1);
      }
      uVar4 = *(uint32_t *)((long)pTVar11 - 4);
      pTVar11[-1] = *pcVar9;
      (local_210->u32).lo = 0;
      (local_210->field_2).it = uVar4;
      local_210[1].u32.lo = (uint32_t)L;
      pTVar2 = local_210 + 2;
      *(int *)((long)local_210 + 0xc) = ((int)pTVar2 - (int)pTVar11) + 2;
      L->top = pTVar2;
      L->base = pTVar2;
      return 0;
    }
LAB_0014b637:
    local_1f8 = *(ulong *)(uVar8 + 8);
  }
  memset(local_1e8,0,0xb0);
  uVar3 = (ushort)pCVar17->info;
  uVar23 = pCVar19[uVar3].info;
  pCVar19 = pCVar19 + uVar3;
  if ((uVar23 & 0xf8000000) == 0x38000000) {
    local_248 = 0;
    if ((pCVar19->size != 8) && (pCVar19->size != 0x10)) {
LAB_0014b6ab:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else if ((uVar23 & 0xf4000000) == 0x34000000 || (uVar23 & 0xf0000000) == 0x10000000) {
    pvVar10 = lj_mem_newgco(L,pCVar19->size + 8);
    *(undefined1 *)((long)pvVar10 + 5) = 10;
    *(ushort *)((long)pvVar10 + 6) = uVar3;
    pTVar11 = L->top;
    L->top = pTVar11 + 1;
    (pTVar11->u32).lo = (uint32_t)pvVar10;
    (pTVar11->field_2).it = 0xfffffff5;
    if ((pCVar19->info & 0xf0000000) == 0x10000000) {
      local_228.u64 = 0;
      iVar22 = ccall_classify_struct(cts,pCVar19,(int *)&local_228.u64,0);
      local_1eb = iVar22 != 0;
      if ((bool)local_1eb) {
        local_168[0].u64 = (long)pvVar10 + 8;
      }
      local_248 = (ulong)(byte)local_1eb;
    }
    else {
      local_248 = 0;
      local_1eb = '\0';
    }
  }
  else {
    local_248 = 0;
  }
  local_208 = local_168;
  uVar8 = (ulong)pCVar17->sib;
  uVar16 = (uint)pCVar17->sib;
  pcVar9 = L->base + 1;
  uVar23 = 0;
  if (pcVar9 < local_210) {
    iVar22 = 1;
    local_238 = 0;
    uVar23 = 0;
    do {
      local_230 = pcVar9;
      if ((int)uVar8 == 0) {
        if ((pCVar17->info & 0x800000) == 0) goto LAB_0014bf2c;
        uVar16 = lj_ccall_ctid_vararg(cts,pcVar9);
        pCVar19 = cts->tab;
        uVar18 = 0;
      }
      else {
        pCVar19 = cts->tab;
        uVar18 = (ulong)pCVar19[uVar8 & 0xffffffff].sib;
        uVar16 = (uint)(ushort)pCVar19[uVar8 & 0xffffffff].info;
      }
      uVar13 = pCVar19[uVar16].info;
      pCVar19 = pCVar19 + uVar16;
      uVar16 = pCVar19->size;
      local_200 = uVar18;
      if (uVar13 < 0x10000000) {
        if (8 < uVar16) goto LAB_0014b6ab;
        uVar24 = uVar16 + 7 >> 3;
        uVar25 = uVar24;
        if ((uVar13 >> 0x1a & 1) == 0) goto LAB_0014ba39;
        bVar27 = 0;
LAB_0014ba19:
        if (uVar24 + uVar23 < 9) {
          pcVar9 = local_1e8 + (ulong)uVar23 * 2;
          uVar23 = uVar24 + uVar23;
        }
        else {
LAB_0014ba65:
          uVar16 = (uint)local_238;
          if (0x30000 < (pCVar19->info & 0xf0000)) {
            uVar13 = -1 << ((byte)(pCVar19->info + 0xd0000 >> 0x10) & 0xf);
            uVar16 = uVar16 + ~uVar13 & uVar13;
          }
          local_238 = (ulong)(uVar16 + uVar25);
          if (0x20 < uVar16 + uVar25) goto LAB_0014b6ab;
          pcVar9 = local_138 + uVar16;
        }
LAB_0014bac2:
        lj_cconv_ct_tv(cts,pCVar19,(uint8_t *)&pcVar9->u64,local_230,iVar22 << 8);
        if (((pCVar19->info & 0xf4000000) == 0) && (uVar16 = pCVar19->size, uVar16 < 4)) {
          if ((pCVar19->info >> 0x17 & 1) == 0) {
            if (uVar16 == 1) {
              uVar16 = (uint)(char)*(byte *)pcVar9;
            }
            else {
              uVar16 = (uint)(short)*(ushort *)pcVar9;
            }
          }
          else if (uVar16 == 1) {
            uVar16 = (uint)*(byte *)pcVar9;
          }
          else {
            uVar16 = (uint)*(ushort *)pcVar9;
          }
          *(uint *)pcVar9 = uVar16;
        }
        uVar8 = local_200;
        if (((bool)(bVar27 & uVar25 == 2)) && (pcVar9 == local_1e8 + (ulong)(uVar23 - 2) * 2)) {
          local_1e8[(ulong)(uVar23 - 1) * 2] = pcVar9[1];
          pcVar9[1].u64 = 0;
        }
      }
      else {
        if ((uVar13 & 0xf8000000) == 0x38000000) {
          if ((uVar16 == 8) || (uVar16 == 0x10)) {
            uVar24 = 1;
            bVar27 = 0;
            uVar25 = uVar16 + 7 >> 3;
            goto LAB_0014ba19;
          }
          goto LAB_0014b6ab;
        }
        if ((uVar13 & 0xf0000000) != 0x10000000) {
          uVar25 = 1;
          if ((uVar13 & 0xf4000000) == 0x34000000) {
            uVar24 = uVar16 + 7 >> 3;
            bVar27 = 1;
            uVar25 = uVar24;
            goto LAB_0014ba19;
          }
LAB_0014ba39:
          uVar16 = (int)local_248 + uVar25;
          if (6 < uVar16) {
            bVar27 = 0;
            goto LAB_0014ba65;
          }
          pcVar9 = local_168 + local_248;
          bVar27 = 0;
          local_248 = (ulong)uVar16;
          goto LAB_0014bac2;
        }
        local_240[0] = 0;
        local_240[1] = 0;
        iVar7 = ccall_classify_struct(cts,pCVar19,(int *)local_240,0);
        if (iVar7 != 0) {
          uVar25 = uVar16 + 7 >> 3;
          if (uVar16 + 7 < 0x18) goto LAB_0014ba39;
          bVar27 = 0;
          goto LAB_0014ba65;
        }
        local_1ec = (byte)local_238;
        local_1ea = (byte)local_248;
        local_1e9 = (byte)uVar23;
        local_228.u64 = 0;
        acStack_220[0].u64 = 0;
        lj_cconv_ct_tv(cts,pCVar19,(uint8_t *)&local_228.u64,local_230,iVar22 << 8);
        uVar14 = (ulong)local_1e9;
        uVar8 = (ulong)local_1ea;
        puVar20 = local_240;
        pcVar9 = &local_228;
        bVar6 = true;
        do {
          bVar15 = bVar6;
          if ((*puVar20 & 1) == 0) {
            local_248 = uVar8;
            if ((*puVar20 & 2) != 0) {
              if (7 < (uint)uVar14) goto LAB_0014bc91;
              local_1e8[uVar14 * 2].u64 = *(uint64_t *)pcVar9;
              uVar14 = (ulong)((uint)uVar14 + 1);
            }
          }
          else {
            if (5 < (uint)uVar8) {
LAB_0014bc91:
              uVar8 = (ulong)local_1ec;
              iVar7 = 2 - (uint)(local_240[1] == 0);
              uVar23 = iVar7 + (uint)local_1ec;
              if (0x20 < uVar23) goto LAB_0014b6ab;
              local_1ec = (byte)uVar23;
              memcpy(local_138 + uVar8,&local_228,(ulong)(uint)(iVar7 * 8));
              local_248 = (ulong)local_1ea;
              uVar14 = (ulong)local_1e9;
              goto LAB_0014bcd4;
            }
            local_248 = (ulong)((uint)uVar8 + 1);
            local_168[uVar8].u64 = *(uint64_t *)pcVar9;
          }
          uVar8 = local_248;
          puVar20 = local_240 + 1;
          pcVar9 = acStack_220;
          bVar6 = false;
        } while (bVar15);
        local_1ea = (byte)local_248;
        local_1e9 = (byte)uVar14;
LAB_0014bcd4:
        local_238 = (ulong)local_1ec;
        local_248 = local_248 & 0xff;
        uVar23 = (uint)(byte)uVar14;
        uVar8 = uVar18;
      }
      uVar16 = (uint)uVar8;
      iVar22 = iVar22 + 1;
      pcVar9 = local_230 + 1;
    } while (pcVar9 < local_210);
    uVar13 = (uint)local_238;
  }
  else {
    uVar13 = 0;
  }
  if (uVar16 != 0) {
LAB_0014bf2c:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  local_1e9 = (byte)uVar23;
  local_1ec = (byte)uVar13;
  local_1f0 = 8;
  if (1 < uVar13) {
    local_1f0 = uVar13 * 8 | 8;
  }
  pCVar19 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  lj_vm_ffi_call();
  if ((cts->cb).slot != 0xffffffff) {
    local_228.u64 = local_1f8 | 0xffff000000000000;
    pTVar11 = lj_tab_set(L,cts->miscmap,&local_228);
    (pTVar11->field_2).it = 0xfffffffd;
  }
  pCVar26 = cts->tab;
  uVar3 = *(ushort *)((long)pCVar17 + ((long)pCVar26 - (long)pCVar19));
  uVar23 = pCVar26[uVar3].info;
  if ((uVar23 & 0xf0000000) == 0x40000000) {
    return 0;
  }
  pCVar26 = pCVar26 + uVar3;
  if ((uVar23 & 0xf0000000) == 0x10000000) {
    if (local_1eb == '\0') {
      uVar23 = L->top[-1].u32.lo;
      local_240[0] = 0;
      local_240[1] = 0;
      uVar8 = 0;
      ccall_classify_struct(cts,pCVar26,(int *)local_240,0);
      uVar16 = pCVar26->size;
      uVar13 = 0;
      puVar20 = local_240;
      pcVar9 = &local_228;
      bVar6 = true;
      do {
        bVar15 = bVar6;
        if ((*puVar20 & 1) == 0) {
          if ((*puVar20 & 2) != 0) {
            pcVar21 = local_1e8 + uVar8 * 2;
            uVar8 = (ulong)((int)uVar8 + 1);
            goto LAB_0014be47;
          }
        }
        else {
          uVar18 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          pcVar21 = local_168 + uVar18;
LAB_0014be47:
          *pcVar9 = *pcVar21;
        }
        puVar20 = local_240 + 1;
        pcVar9 = acStack_220;
        bVar6 = false;
      } while (bVar15);
      memcpy((void *)((ulong)uVar23 + 8),&local_228,(ulong)uVar16);
    }
    goto LAB_0014beec;
  }
  if ((uVar23 & 0xf4000000) == 0x4000000) {
LAB_0014bec0:
    local_208 = local_1e8;
  }
  else {
    if ((uVar23 & 0xf4000000) == 0x34000000) {
      uVar8 = (ulong)L->top[-1].u32.lo;
      CVar5 = pCVar26->size;
      *(cTValue *)(uVar8 + 8) = local_1e8[0];
      if (CVar5 != 8) {
        *(cTValue *)(uVar8 + 0x10) = local_1e8[2];
      }
      goto LAB_0014beec;
    }
    if ((uVar23 & 0xf8000000) == 0x38000000) goto LAB_0014bec0;
  }
  iVar22 = lj_cconv_tv_ct(cts,pCVar26,0,L->top + -1,(uint8_t *)&local_208->u64);
  if (iVar22 == 0) {
    return 1;
  }
LAB_0014beec:
  uVar8 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar8 + 0x24) <= *(uint *)(uVar8 + 0x20)) {
    lj_gc_step(L);
    return 1;
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___call)	LJLIB_REC(cdata_call)
{
  CTState *cts = ctype_cts(L);
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (cd->ctypeid == CTID_CTYPEID) {
    id = *(CTypeID *)cdataptr(cd);
    mm = MM_new;
  } else {
    int ret = lj_ccall_func(L, cd);
    if (ret >= 0)
      return ret;
  }
  /* Handle ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (tv)
    return lj_meta_tailcall(L, tv);
  else if (mm == MM_call)
    lj_err_callerv(L, LJ_ERR_FFI_BADCALL, strdata(lj_ctype_repr(L, id, NULL)));
  return lj_cf_ffi_new(L);
}